

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Program.cpp
# Opt level: O2

string * __thiscall
soul::Program::ProgramImpl::getStructNameWithQualificationIfNeeded_abi_cxx11_
          (string *__return_storage_ptr__,ProgramImpl *this,pool_ptr<const_soul::Module> *context,
          Structure *s)

{
  pointer ppVar1;
  bool bVar2;
  Module *pMVar3;
  pointer ppVar4;
  ArrayView<soul::RefCountedPtr<soul::Structure>_> local_60;
  string local_50;
  
  ppVar4 = (this->modules).
           super__Vector_base<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (this->modules).
           super__Vector_base<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (ppVar4 == ppVar1) {
      throwInternalCompilerError("getStructNameWithQualificationIfNeeded",0xe5);
    }
    local_60.s = (ppVar4->object->structs).structs.items;
    local_60.e = local_60.s + (ppVar4->object->structs).structs.numActive;
    bVar2 = contains<soul::ArrayView<soul::RefCountedPtr<soul::Structure>>,soul::Structure_const&>
                      (&local_60,s);
    if (bVar2) break;
    ppVar4 = ppVar4 + 1;
  }
  if (context->object == (Module *)0x0) {
    pMVar3 = ppVar4->object;
  }
  else {
    pMVar3 = ppVar4->object;
    if (pMVar3 == context->object) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&s->name);
      return __return_storage_ptr__;
    }
  }
  TokenisedPathString::join(&local_50,&pMVar3->fullName,&s->name);
  stripRootNamespaceFromQualifiedPath(__return_storage_ptr__,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

std::string getStructNameWithQualificationIfNeeded (pool_ptr<const Module> context, const Structure& s) const
    {
        for (auto& m : modules)
        {
            if (contains (m->structs.get(), s))
            {
                if (context != nullptr && m == context)
                    return s.getName();

                return stripRootNamespaceFromQualifiedPath (TokenisedPathString::join (m->fullName, s.getName()));
            }
        }

        SOUL_ASSERT_FALSE;
        return s.getName();
    }